

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O0

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,ExpressionList *expression_list)

{
  bool bVar1;
  ExpressionList *this_00;
  reference ppEVar2;
  IRTStorage local_58;
  BaseElement *local_40;
  Expression *expression;
  iterator __end1;
  iterator __begin1;
  vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_> *__range1;
  ExpressionList *new_expression_list;
  ExpressionList *expression_list_local;
  BlockFormerVisitor *this_local;
  
  this_00 = (ExpressionList *)operator_new(0x20);
  memset(this_00,0,0x20);
  ExpressionList::ExpressionList(this_00);
  __end1 = std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>::begin
                     (&expression_list->expressions_);
  expression = (Expression *)
               std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>::end
                         (&expression_list->expressions_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<IRT::Expression_**,_std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>_>
                                *)&expression);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<IRT::Expression_**,_std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>_>
              ::operator*(&__end1);
    local_40 = &(*ppEVar2)->super_BaseElement;
    TemplateVisitor<IRT::IRTStorage>::Accept
              (&local_58,&this->super_TemplateVisitor<IRT::IRTStorage>,local_40);
    ExpressionList::Add(this_00,local_58.expression_);
    __gnu_cxx::
    __normal_iterator<IRT::Expression_**,_std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>_>
    ::operator++(&__end1);
  }
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.expression_list_ = this_00;
  return;
}

Assistant:

void BlockFormerVisitor::Visit(ExpressionList* expression_list) {
  auto new_expression_list = new ExpressionList();

  for (Expression* expression : expression_list->expressions_) {
    new_expression_list->Add(Accept(expression).expression_);
  }

  tos_value_.expression_list_ = new_expression_list;
}